

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

void state_set_value(apx_vm_writeState_t *self,dtl_dv_t *dv)

{
  dtl_dv_type_id type_id;
  dtl_dv_t *dv_local;
  apx_vm_writeState_t *self_local;
  
  if (self == (apx_vm_writeState_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x3ac,"void state_set_value(apx_vm_writeState_t *, const dtl_dv_t *)");
  }
  type_id = dtl_dv_type(dv);
  state_reset(self,type_id);
  switch(self->value_type) {
  case DTL_DV_INVALID:
  case DTL_DV_NULL:
    (self->value).sv = (dtl_sv_t *)0x0;
    break;
  case DTL_DV_SCALAR:
    (self->value).dv = dv;
    break;
  case DTL_DV_ARRAY:
    (self->value).dv = dv;
    break;
  case DTL_DV_HASH:
    (self->value).dv = dv;
  }
  return;
}

Assistant:

static void state_set_value(apx_vm_writeState_t* self, dtl_dv_t const* dv)
{
   assert(self != NULL);
   state_reset(self, dtl_dv_type(dv));
   switch (self->value_type)
   {
   case DTL_DV_INVALID:
   case DTL_DV_NULL:
      self->value.dv = NULL;
      break;
   case DTL_DV_SCALAR:
      self->value.sv = (dtl_sv_t*)dv;
      break;
   case DTL_DV_ARRAY:
      self->value.av = (dtl_av_t*)dv;
      break;
   case DTL_DV_HASH:
      self->value.hv = (dtl_hv_t*)dv;
      break;
   }
}